

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int omp_get_place_num_procs(int place_num)

{
  int in_EDI;
  kmp_affin_mask_t *mask;
  int retval;
  int i;
  int local_10;
  int local_c;
  int local_4;
  
  local_10 = 0;
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if ((in_EDI < 0) || ((int)__kmp_affinity_num_masks <= in_EDI)) {
    local_4 = 0;
  }
  else {
    for (local_c = 0; (ulong)(long)local_c < __kmp_affin_mask_size << 3; local_c = local_c + 1) {
      if ((((uint)__kmp_affin_fullMask[local_c / 8] & 1 << ((byte)((long)local_c % 8) & 0x1f)) != 0)
         && (((uint)__kmp_affinity_masks[(long)(local_c / 8) + (long)in_EDI * __kmp_affin_mask_size]
             & 1 << ((byte)((long)local_c % 8) & 0x1f)) != 0)) {
        local_10 = local_10 + 1;
      }
    }
    local_4 = local_10;
  }
  return local_4;
}

Assistant:

int FTN_STDCALL
FTN_GET_PLACE_NUM_PROCS( int place_num )
{
    #if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
        return 0;
    #else
        int i;
        int retval = 0;
        if ( ! TCR_4(__kmp_init_middle) ) {
            __kmp_middle_initialize();
        }
        if ( place_num < 0 || place_num >= (int)__kmp_affinity_num_masks )
            return 0;
        kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
        KMP_CPU_SET_ITERATE(i, mask) {
            if ((! KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
              (!KMP_CPU_ISSET(i, mask))) {
                continue;
            }
            ++retval;
        }
        return retval;
    #endif
}